

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,void *data,int alpha,int pad,
           char *fmt,...)

{
  byte bVar1;
  byte bVar3;
  char in_AL;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  byte bVar8;
  int iVar9;
  FILE *fmt_00;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint8 px [3];
  uint32 zero;
  va_list v;
  byte local_143 [3];
  int local_140;
  uint local_13c;
  uint local_138;
  undefined4 local_134;
  void *local_130;
  long local_128;
  long local_120;
  FILE *local_118;
  ulong local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  byte bVar2;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_140 = comp;
  local_13c = x;
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &stack0x00000028;
    local_108.gp_offset = 0x30;
    local_108.fp_offset = 0x30;
    writefv((FILE *)__stream,fmt,&local_108);
    local_134 = 0;
    if (y != 0) {
      lVar11 = (long)local_140;
      local_128 = (long)y;
      local_120 = (long)(int)local_13c;
      local_110 = (ulong)local_13c;
      local_130 = (void *)((local_128 + -1) * lVar11 * local_120 + (long)data);
      fmt_00 = (FILE *)-(lVar11 * local_120);
      local_138 = local_140 - 1;
      local_118 = fmt_00;
      do {
        local_128 = local_128 + -1;
        if (0 < (int)local_13c) {
          lVar6 = local_128 * local_120;
          uVar13 = 0;
          pvVar7 = local_130;
          do {
            pbVar12 = (byte *)((uVar13 + lVar6) * lVar11 + (long)data);
            if (local_138 < 2) {
              bVar8 = *pbVar12;
              uVar5 = (ulong)(uint)bVar8;
              uVar10 = (ulong)(uint)bVar8;
LAB_00159b1e:
              writef((FILE *)__stream,(char *)fmt_00,uVar5,(ulong)bVar8,uVar10);
            }
            else {
              if (local_140 == 3) {
LAB_00159aff:
                bVar8 = pbVar12[1];
                bVar1 = pbVar12[2];
                bVar2 = *pbVar12;
LAB_00159b0d:
                uVar10 = (ulong)bVar2;
                uVar5 = (ulong)bVar1;
                goto LAB_00159b1e;
              }
              if (local_140 == 4) {
                if (alpha != 0) goto LAB_00159aff;
                bVar3 = pbVar12[3];
                lVar4 = 0;
                do {
                  iVar9 = ((uint)*(byte *)((long)pvVar7 + lVar4) -
                          (uint)(byte)(&DAT_00188e65)[lVar4]) * (uint)bVar3;
                  iVar9 = (uint)((ulong)((long)iVar9 * 0x80808081) >> 0x27) - (iVar9 >> 0x1f);
                  bVar8 = (char)iVar9 + (&DAT_00188e65)[lVar4];
                  fmt_00 = (FILE *)(ulong)CONCAT31((int3)((uint)iVar9 >> 8),bVar8);
                  local_143[lVar4] = bVar8;
                  lVar4 = lVar4 + 1;
                  bVar8 = local_143[1];
                  bVar1 = local_143[2];
                  bVar2 = local_143[0];
                } while (lVar4 != 3);
                goto LAB_00159b0d;
              }
            }
            if (0 < alpha) {
              fmt_00 = __stream;
              fputc((int)(char)pbVar12[lVar11 + -1],__stream);
            }
            uVar13 = uVar13 + 1;
            pvVar7 = (void *)((long)pvVar7 + lVar11);
          } while (uVar13 != local_110);
        }
        fmt_00 = (FILE *)(ulong)(uint)pad;
        fwrite(&local_134,(size_t)fmt_00,1,__stream);
        local_130 = (void *)((long)local_130 + (long)local_118);
      } while (local_128 != 0);
    }
    fclose(__stream);
  }
  return (int)(__stream != (FILE *)0x0);
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, void *data, int alpha, int pad, char *fmt, ...)
{
   FILE *f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad);
      fclose(f);
   }
   return f != NULL;
}